

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall
helics::apps::Player::addEndpoint(Player *this,string_view endpointName,string_view endpointType)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  size_type kp;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  key_type *__k;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *__args_2;
  char **in_stack_ffffffffffffff70;
  InterfaceVisibility *in_stack_ffffffffffffff78;
  char **__args;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_30 [6];
  
  local_30[0]._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
               *)in_stack_ffffffffffffff58,(key_type *)0x3dd510);
  local_38._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)in_stack_ffffffffffffff58);
  bVar1 = CLI::std::__detail::operator==(local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((in_RDI[8]._M_len & 1) == 0) {
      __args = &in_RDI[0x18]._M_str;
      CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                 &in_RDI->_M_str);
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
      emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)in_RDI,
                 (InterfaceVisibility *)__args,(CombinationFederate **)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        (in_RDI,(char *)in_stack_ffffffffffffff78,
                         (size_type)in_stack_ffffffffffffff70);
      if (sVar3 == 0xffffffffffffffff) {
        in_stack_ffffffffffffff70 = &in_RDI[0x18]._M_str;
        CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                   &in_RDI->_M_str);
        std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
        emplace_back<helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                  ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)
                   in_stack_ffffffffffffff70,(CombinationFederate **)in_stack_ffffffffffffff68,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
      }
      else {
        __args_2 = (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[0x18]._M_str;
        CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                   &in_RDI->_M_str);
        std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
        emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                  ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)in_RDI,
                   in_stack_ffffffffffffff78,(CombinationFederate **)in_stack_ffffffffffffff70,
                   __args_2,(basic_string_view<char,_std::char_traits<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
    }
    sVar4 = CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::size
                      ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x3dd681);
    iVar2 = (int)sVar4 + -1;
    __k = (key_type *)(in_RDI + 0x21);
    CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::back
              ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)
               in_stack_ffffffffffffff70);
    Interface::getName_abi_cxx11_((Interface *)CONCAT44(iVar2,in_stack_ffffffffffffff60));
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff60));
    pmVar5 = CLI::std::
             unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           *)CONCAT44(iVar2,in_stack_ffffffffffffff60),__k);
    *pmVar5 = iVar2;
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Endpoint already exists\n");
  }
  return;
}

Assistant:

void Player::addEndpoint(std::string_view endpointName, std::string_view endpointType)
{
    // skip already existing publications
    if (eptids.find(endpointName) != eptids.end()) {
        std::cerr << "Endpoint already exists\n";
        return;
    }
    if (!useLocal) {
        endpoints.emplace_back(helics::InterfaceVisibility::GLOBAL,
                               fed.get(),
                               endpointName,
                               endpointType);
    } else {
        auto kp = endpointName.find_first_of("./");
        if (kp == std::string::npos) {
            endpoints.emplace_back(fed.get(), endpointName, endpointType);
        } else {
            endpoints.emplace_back(helics::InterfaceVisibility::GLOBAL,
                                   fed.get(),
                                   endpointName,
                                   endpointType);
        }
    }
    eptids[endpoints.back().getName()] = static_cast<int>(endpoints.size()) - 1;
}